

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::constraintJacobianWRTControl
          (LinearConstraint *this,double time,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  element_type *peVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ostream *poVar8;
  string *psVar9;
  bool isValid;
  ostringstream errorMsg;
  char local_1c9;
  double local_1c8;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1c8 = time;
  sVar4 = Constraint::constraintSize(&this->super_Constraint);
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,sVar4 & 0xffffffff);
  if (this->m_pimpl->constrainsControl != true) {
    iDynTree::MatrixDynSize::zero();
    return true;
  }
  local_1c9 = '\0';
  peVar1 = (this->m_pimpl->controlConstraintMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(local_1c8,peVar1,&local_1c9);
  if (local_1c9 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Unable to retrieve a valid control constraint matrix at time: "
               ,0x3e);
    poVar8 = std::ostream::_M_insert<double>(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar2,"constraintJacobianWRTControl",(char *)local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
    return false;
  }
  lVar5 = iDynTree::MatrixDynSize::cols();
  lVar6 = iDynTree::VectorDynSize::size();
  if (lVar5 == lVar6) {
    sVar4 = iDynTree::MatrixDynSize::rows();
    sVar7 = Constraint::constraintSize(&this->super_Constraint);
    if (sVar4 == sVar7) goto LAB_0016f767;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"The control constraint matrix at time: ",0x27);
  poVar8 = std::ostream::_M_insert<double>(local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             " has dimensions not matching with the specified control space dimension or constraint dimension."
             ,0x60);
  psVar9 = Constraint::name_abi_cxx11_(&this->super_Constraint);
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::stringbuf::str();
  iDynTree::reportError(pcVar2,"constraintJacobianWRTControl",(char *)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
LAB_0016f767:
  iDynTree::MatrixDynSize::operator=(jacobian,(MatrixDynSize *)CONCAT44(extraout_var,iVar3));
  return true;
}

Assistant:

bool LinearConstraint::constraintJacobianWRTControl(double time,
                                                  const VectorDynSize& /*state*/,
                                                  const VectorDynSize& control,
                                                  MatrixDynSize& jacobian)
        {
            jacobian.resize(static_cast<unsigned int>(constraintSize()), control.size());

            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "constraintJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "constraintJacobianWRTControl", errorMsg.str().c_str());
                }

                jacobian = controlConstraintMatrix;
            } else {
                jacobian.zero();
            }

            return true;
        }